

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Qbf_Man_t * Gia_QbfAlloc(Gia_Man_t *pGia,int nPars,int fGlucose,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Cnf_Dat_t *p_00;
  Qbf_Man_t *pQVar4;
  abctime aVar5;
  sat_solver *psVar6;
  Vec_Int_t *pVVar7;
  bmcg_sat_solver *local_40;
  Cnf_Dat_t *pCnf;
  Qbf_Man_t *p;
  int fVerbose_local;
  int fGlucose_local;
  int nPars_local;
  Gia_Man_t *pGia_local;
  
  pGVar3 = Gia_ManPo(pGia,0);
  Gia_ObjFlipFaninC0(pGVar3);
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  pGVar3 = Gia_ManPo(pGia,0);
  Gia_ObjFlipFaninC0(pGVar3);
  pQVar4 = (Qbf_Man_t *)calloc(1,0x58);
  aVar5 = Abc_Clock();
  pQVar4->clkStart = aVar5;
  pQVar4->pGia = pGia;
  pQVar4->nPars = nPars;
  iVar1 = Gia_ManPiNum(pGia);
  pQVar4->nVars = iVar1 - nPars;
  pQVar4->fVerbose = fVerbose;
  iVar1 = p_00->nVars;
  iVar2 = Gia_ManPiNum(pGia);
  pQVar4->iParVarBeg = iVar1 - iVar2;
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pQVar4->pSatVer = psVar6;
  psVar6 = sat_solver_new();
  pQVar4->pSatSyn = psVar6;
  if (fGlucose == 0) {
    local_40 = (bmcg_sat_solver *)0x0;
  }
  else {
    local_40 = bmcg_sat_solver_start();
  }
  pQVar4->pSatSynG = local_40;
  iVar1 = Gia_ManPiNum(pGia);
  pVVar7 = Vec_IntAlloc(iVar1);
  pQVar4->vValues = pVVar7;
  pVVar7 = Vec_IntStartFull(nPars);
  pQVar4->vParMap = pVVar7;
  pVVar7 = Vec_IntAlloc(nPars);
  pQVar4->vLits = pVVar7;
  sat_solver_setnvars(pQVar4->pSatSyn,nPars);
  if (pQVar4->pSatSynG != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_set_nvars(pQVar4->pSatSynG,nPars);
  }
  Cnf_DataFree(p_00);
  return pQVar4;
}

Assistant:

Qbf_Man_t * Gia_QbfAlloc( Gia_Man_t * pGia, int nPars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p;
    Cnf_Dat_t * pCnf;
    Gia_ObjFlipFaninC0( Gia_ManPo(pGia, 0) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    Gia_ObjFlipFaninC0( Gia_ManPo(pGia, 0) );
    p = ABC_CALLOC( Qbf_Man_t, 1 );
    p->clkStart   = Abc_Clock();
    p->pGia       = pGia;
    p->nPars      = nPars;
    p->nVars      = Gia_ManPiNum(pGia) - nPars;
    p->fVerbose   = fVerbose;
    p->iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    p->pSatVer    = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    p->pSatSyn    = sat_solver_new();
    p->pSatSynG   = fGlucose ? bmcg_sat_solver_start() : NULL; 
    p->vValues    = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    p->vParMap    = Vec_IntStartFull( nPars );
    p->vLits      = Vec_IntAlloc( nPars );
    sat_solver_setnvars( p->pSatSyn, nPars );
    if ( p->pSatSynG ) bmcg_sat_solver_set_nvars( p->pSatSynG, nPars );
    Cnf_DataFree( pCnf );
    return p;
}